

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

bool __thiscall cmCTestMultiProcessHandler::CheckCycles(cmCTestMultiProcessHandler *this)

{
  cmCTest *pcVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  mapped_type *ppcVar4;
  ostream *poVar5;
  _Rb_tree_header *p_Var6;
  bool bVar7;
  bool bVar8;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar9;
  int test;
  int root;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  ostringstream cmCTestLog_msg;
  _Rb_tree_color local_270;
  _Rb_tree_color local_26c;
  _Rb_tree_color **local_268;
  undefined8 uStack_260;
  _Rb_tree_color *local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  _Rb_tree_color *local_238;
  _Rb_tree_color *p_Stack_230;
  _Rb_tree_color *local_228;
  long lStack_220;
  _Base_ptr local_210;
  _Base_ptr local_208;
  PropertiesMap *local_200;
  long *local_1f8;
  long local_1e8 [2];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1d8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Checking test dependency graph...",0x21);
  std::ios::widen((char)(ostringstream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x32b,(char *)local_268,this->Quiet);
  if (local_268 != &local_258) {
    operator_delete(local_268,(ulong)((long)local_258 + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  p_Var3 = (this->Tests).
           super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_210 = &(this->Tests).
               super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
  bVar7 = p_Var3 == local_210;
  if (bVar7) {
LAB_0031c2fa:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Checking test dependency graph end",0x22);
    std::ios::widen((char)(ostringstream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x34a,(char *)local_268,this->Quiet);
    if (local_268 != &local_258) {
      operator_delete(local_268,(ulong)((long)local_258 + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    return bVar7;
  }
  local_200 = &this->Properties;
  do {
    local_26c = p_Var3[1]._M_color;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1d8._M_impl.super__Rb_tree_header._M_header;
    local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_228 = (_Rb_tree_color *)0x0;
    lStack_220 = 0;
    local_238 = (_Rb_tree_color *)0x0;
    p_Stack_230 = (_Rb_tree_color *)0x0;
    local_248 = 0;
    uStack_240 = 0;
    local_258 = (_Rb_tree_color *)0x0;
    uStack_250 = 0;
    local_268 = (_Rb_tree_color **)0x0;
    uStack_260 = 0;
    local_208 = p_Var3;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
    std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
              ((_Deque_base<int,_std::allocator<int>_> *)&local_268,0);
    if (local_238 == local_228 + -1) {
      std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                ((deque<int,std::allocator<int>> *)&local_268,(int *)&local_26c);
    }
    else {
      *local_238 = local_26c;
      local_238 = local_238 + 1;
    }
LAB_0031c0b7:
    bVar8 = local_238 == local_258;
    if (!bVar8) {
      if (local_238 == p_Stack_230) {
        local_270 = *(_Rb_tree_color *)(*(long *)(lStack_220 + -8) + 0x1fc);
        operator_delete(p_Stack_230,0x200);
        p_Stack_230 = *(_Rb_tree_color **)(lStack_220 + -8);
        local_228 = p_Stack_230 + 0x80;
        local_238 = p_Stack_230 + 0x7f;
        lStack_220 = lStack_220 + -8;
      }
      else {
        local_270 = local_238[-1];
        local_238 = local_238 + -1;
      }
      pVar9 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&local_1d8,(int *)&local_270);
      if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pmVar2 = std::
                 map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                 ::operator[](&(this->Tests).
                               super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                              ,(key_type *)&local_270);
        p_Var3 = (pmVar2->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
                 super__Rb_tree_header._M_header._M_left;
        while( true ) {
          pmVar2 = std::
                   map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                   ::operator[](&(this->Tests).
                                 super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                                ,(key_type *)&local_270);
          p_Var6 = &(pmVar2->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
                    super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var3 == p_Var6) break;
          if (p_Var3[1]._M_color == local_26c) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "Error: a cycle exists in the test dependency graph for the test \"",0x41);
            ppcVar4 = std::
                      map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                      ::operator[](&local_200->
                                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                   ,(key_type *)&local_26c);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,((*ppcVar4)->Name)._M_dataplus._M_p,
                                ((*ppcVar4)->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\".\nPlease fix the cycle and run ctest again.\n",0x2d);
            pcVar1 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,6,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                         ,0x340,(char *)local_1f8,false);
            if (local_1f8 != local_1e8) {
              operator_delete(local_1f8,local_1e8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            if ((_Rb_tree_header *)p_Var3 != p_Var6) {
              std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                        ((_Deque_base<int,_std::allocator<int>_> *)&local_268);
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              ~_Rb_tree(&local_1d8);
              if (bVar8) goto LAB_0031c2e1;
              if (bVar7 == false) {
                return false;
              }
              goto LAB_0031c2fa;
            }
            break;
          }
          if (local_238 == local_228 + -1) {
            std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                      ((deque<int,std::allocator<int>> *)&local_268,(int *)(p_Var3 + 1));
          }
          else {
            *local_238 = p_Var3[1]._M_color;
            local_238 = local_238 + 1;
          }
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
        }
      }
      goto LAB_0031c0b7;
    }
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              ((_Deque_base<int,_std::allocator<int>_> *)&local_268);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_1d8);
LAB_0031c2e1:
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(local_208);
    bVar7 = p_Var3 == local_210;
    if (bVar7) goto LAB_0031c2fa;
  } while( true );
}

Assistant:

bool cmCTestMultiProcessHandler::CheckCycles()
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Checking test dependency graph..." << std::endl,
                     this->Quiet);
  for (TestMap::iterator it = this->Tests.begin(); it != this->Tests.end();
       ++it) {
    // DFS from each element to itself
    int root = it->first;
    std::set<int> visited;
    std::stack<int> s;
    s.push(root);
    while (!s.empty()) {
      int test = s.top();
      s.pop();
      if (visited.insert(test).second) {
        for (TestSet::iterator d = this->Tests[test].begin();
             d != this->Tests[test].end(); ++d) {
          if (*d == root) {
            // cycle exists
            cmCTestLog(
              this->CTest, ERROR_MESSAGE,
              "Error: a cycle exists in the test dependency graph "
              "for the test \""
                << this->Properties[root]->Name
                << "\".\nPlease fix the cycle and run ctest again.\n");
            return false;
          }
          s.push(*d);
        }
      }
    }
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Checking test dependency graph end" << std::endl,
                     this->Quiet);
  return true;
}